

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key-storage.c
# Opt level: O2

ndn_hmac_key_t * ndn_key_storage_get_empty_hmac_key(void)

{
  ndn_hmac_key_t *pnVar1;
  ndn_hmac_key_t *pnVar2;
  long lVar3;
  ndn_hmac_key_t *pnVar4;
  
  if (!_key_storage_initialized) {
    _ndn_key_storage_init();
  }
  lVar3 = 0xb;
  pnVar4 = (ndn_hmac_key_t *)(storage.ecc_prv_keys[7].abs_key.key_value + 0x18);
  do {
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      return (ndn_hmac_key_t *)0x0;
    }
    pnVar1 = pnVar4 + 1;
    pnVar2 = pnVar4 + 1;
    pnVar4 = pnVar1;
  } while (pnVar2->key_id != 0xffffffff);
  return pnVar1;
}

Assistant:

ndn_hmac_key_t*
ndn_key_storage_get_empty_hmac_key(void)
{
  if (!_key_storage_initialized)
    _ndn_key_storage_init();
  for (uint8_t i = 0; i < NDN_SEC_SIGNING_KEYS_SIZE; i++) {
    if (storage.hmac_keys[i].key_id == NDN_SEC_INVALID_KEY_ID) {
      return &storage.hmac_keys[i];
    }
  }
  return NULL;
}